

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::BasicComputeTestInstance::configCommandBuffer
          (BasicComputeTestInstance *this)

{
  VkResult VVar1;
  DeviceInterface *pDVar2;
  pointer pVVar3;
  uint uVar4;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x49])
                    (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x6e6);
  (*pDVar2->_vptr_DeviceInterface[0x70])
            (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (this->super_TimestampTestInstance).m_queryPool.
             super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,0,8);
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             (this->m_computePipelines).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object
             .m_internal);
  (*pDVar2->_vptr_DeviceInterface[0x56])
            (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
             m_internal,0,1,&this->m_descriptorSet,0,0);
  (*pDVar2->_vptr_DeviceInterface[0x5d])
            (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x80,1,1);
  uVar4 = 0;
  for (pVVar3 = (this->super_TimestampTestInstance).m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar3 != (this->super_TimestampTestInstance).m_stages.
                super__Vector_base<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar3 = pVVar3 + 1) {
    (*pDVar2->_vptr_DeviceInterface[0x71])
              (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,(ulong)*pVVar3,
               (this->super_TimestampTestInstance).m_queryPool.
               super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal,(ulong)uVar4)
    ;
    uVar4 = uVar4 + 1;
  }
  VVar1 = (*pDVar2->_vptr_DeviceInterface[0x4a])
                    (pDVar2,(this->super_TimestampTestInstance).m_cmdBuffer.
                            super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x6f4);
  return;
}

Assistant:

void BasicComputeTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&     vk                 = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType          sType;
		DE_NULL,                                        // const void*              pNext;
		0u,                                             // VkCmdBufferOptimizeFlags flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,

	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	vk.cmdBindPipeline(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_computePipelines);
	vk.cmdBindDescriptorSets(*m_cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *m_pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);
	vk.cmdDispatch(*m_cmdBuffer, 128u, 1u, 1u);

	deUint32 timestampEntry = 0u;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));


}